

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_temp_impl(llama_token_data_array *cur_p,float temp)

{
  ulong uVar1;
  llama_token_data *plVar2;
  size_t sVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  if (temp <= 0.0) {
    uVar1 = cur_p->size;
    if (1 < uVar1) {
      plVar2 = cur_p->data;
      fVar7 = plVar2->logit;
      pfVar4 = &plVar2[1].logit;
      uVar5 = 1;
      uVar6 = 0;
      do {
        if (*pfVar4 <= fVar7) {
          *pfVar4 = -INFINITY;
        }
        else {
          plVar2[uVar6].logit = -INFINITY;
          fVar7 = *pfVar4;
          uVar6 = uVar5;
        }
        uVar5 = uVar5 + 1;
        pfVar4 = pfVar4 + 3;
      } while (uVar1 != uVar5);
    }
  }
  else {
    sVar3 = cur_p->size;
    if (sVar3 != 0) {
      pfVar4 = &cur_p->data->logit;
      do {
        *pfVar4 = *pfVar4 / temp;
        pfVar4 = pfVar4 + 3;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
  }
  return;
}

Assistant:

static void llama_sampler_temp_impl(llama_token_data_array * cur_p, float temp) {
    if (temp <= 0.0f) {
        // find the token with the highest logit and set the rest to -inf
        size_t max_i = 0;
        float  max_l = cur_p->data[0].logit;

        for (size_t i = 1; i < cur_p->size; ++i) {
            if (cur_p->data[i    ].logit > max_l) {
                cur_p->data[max_i].logit = -INFINITY;
                max_i = i;
                max_l = cur_p->data[i].logit;
            } else {
                cur_p->data[i].logit = -INFINITY;
            }
        }

        return;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].logit /= temp;
    }
}